

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O1

void __thiscall
t_swift_generator::generate_swift_service_client_send_function_implementation
          (t_swift_generator *this,ostream *out,t_service *tservice,t_function *tfunction,
          bool needs_protocol)

{
  pointer pcVar1;
  t_struct *ptVar2;
  t_struct *tstruct;
  t_field *ptVar3;
  size_t sVar4;
  ostream *poVar5;
  char *pcVar6;
  t_swift_generator *this_00;
  char *__s;
  pointer pptVar7;
  string funname;
  string argsname;
  string proto;
  t_function send_function;
  char *local_190;
  long local_188;
  char local_180 [16];
  string local_170;
  undefined1 *local_150;
  long local_148;
  undefined1 local_140 [16];
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  t_function local_d0;
  
  local_190 = local_180;
  pcVar1 = (tfunction->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,pcVar1,pcVar1 + (tfunction->name_)._M_string_length);
  this_00 = (t_swift_generator *)g_type_bool;
  std::operator+(&local_f0,"send_",&tfunction->name_);
  t_function::t_function(&local_d0,(t_type *)this_00,&local_f0,tfunction->arglist_,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  function_args_helper_struct_type_abi_cxx11_(&local_170,this_00,tservice,tfunction);
  ptVar2 = tfunction->arglist_;
  pcVar6 = "on outProtocol";
  if ((this->gen_cocoa_ & 1U) != 0) {
    pcVar6 = "__outProtocol";
  }
  __s = "";
  if (needs_protocol) {
    __s = pcVar6;
  }
  local_150 = local_140;
  sVar4 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,__s,__s + sVar4);
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"private func ",0xd);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_d0.name_._M_dataplus._M_p,local_d0.name_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
  tstruct = tfunction->arglist_;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_130,local_150,local_150 + local_148);
  argument_list(&local_110,this,tstruct,&local_130,true);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_110._M_dataplus._M_p,local_110._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,") throws",8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  block_open(this,out);
  if (this->gen_cocoa_ == false) {
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"try outProtocol.writeMessageBegin(name: \"",0x29);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_190,local_188);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\", ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"type: ",6);
    pcVar6 = ".call";
    if (tfunction->oneway_ != false) {
      pcVar6 = ".oneway";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,pcVar6,(ulong)tfunction->oneway_ * 2 + 5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"sequenceID: 0)",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"let args = ",0xb);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_170._M_dataplus._M_p,local_170._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
    pptVar7 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar7 !=
        (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        ptVar3 = *pptVar7;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,(ptVar3->name_)._M_dataplus._M_p,(ptVar3->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,(ptVar3->name_)._M_dataplus._M_p,(ptVar3->name_)._M_string_length);
        pptVar7 = pptVar7 + 1;
        if (pptVar7 !=
            (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
        }
      } while (pptVar7 !=
               (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"try args.write(to: outProtocol)",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"try outProtocol.writeMessageEnd()",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"try __outProtocol.writeMessageBeginWithName(\"",0x2d);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_190,local_188);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\", ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"type: ",6);
    pcVar6 = ".CALL";
    if (tfunction->oneway_ != false) {
      pcVar6 = ".ONEWAY";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,pcVar6,(ulong)tfunction->oneway_ * 2 + 5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"sequenceID: 0)",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"let __args = ",0xd);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_170._M_dataplus._M_p,local_170._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
    pptVar7 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar7 !=
        (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        ptVar3 = *pptVar7;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,(ptVar3->name_)._M_dataplus._M_p,(ptVar3->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,(ptVar3->name_)._M_dataplus._M_p,(ptVar3->name_)._M_string_length);
        pptVar7 = pptVar7 + 1;
        if (pptVar7 !=
            (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
        }
      } while (pptVar7 !=
               (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"try ",4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_170._M_dataplus._M_p,local_170._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,".writeValue(__args, toProtocol: __outProtocol)",0x2e);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"try __outProtocol.writeMessageEnd()",0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  block_close(this,out,true);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_150 != local_140) {
    operator_delete(local_150);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  t_function::~t_function(&local_d0);
  if (local_190 != local_180) {
    operator_delete(local_190);
  }
  return;
}

Assistant:

void t_swift_generator::generate_swift_service_client_send_function_implementation(ostream& out,
                                                                                   t_service *tservice,
                                                                                   t_function* tfunction,
                                                                                   bool needs_protocol) {

  string funname = tfunction->get_name();

  t_function send_function(g_type_bool,
                           "send_" + tfunction->get_name(),
                           tfunction->get_arglist());

  string argsname = function_args_helper_struct_type(tservice, tfunction);
  t_struct* arg_struct = tfunction->get_arglist();

  string proto = needs_protocol ? (gen_cocoa_ ? "__outProtocol" : "on outProtocol") : "";
  // Open function
  indent(out) << "private func " << send_function.get_name() << "("
              << argument_list(tfunction->get_arglist(), proto, true)
              << ") throws";
  block_open(out);
  if (!gen_cocoa_) {
    // Serialize the request
    indent(out) << "try outProtocol.writeMessageBegin(name: \"" << funname << "\", "
                << "type: " << (tfunction->is_oneway() ? ".oneway" : ".call") << ", "
                << "sequenceID: 0)" << endl;

    indent(out) << "let args = " << argsname << "(";

    // write out function parameters

    const vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator f_iter;

    for (f_iter = fields.begin(); f_iter != fields.end();) {
      t_field *tfield = (*f_iter);
      out << tfield->get_name() << ": " << tfield->get_name();
      if (++f_iter != fields.end()) {
        out << ", ";
      }
    }
    out << ")" << endl;
    indent(out) << "try args.write(to: outProtocol)" << endl;
    indent(out) << "try outProtocol.writeMessageEnd()" << endl;
  } else {
    out << endl;

    // Serialize the request
    indent(out) << "try __outProtocol.writeMessageBeginWithName(\"" << funname << "\", "
                << "type: " << (tfunction->is_oneway() ? ".ONEWAY" : ".CALL") << ", "
                << "sequenceID: 0)" << endl;

    out << endl;

    indent(out) << "let __args = " << argsname << "(";

    // write out function parameters

    const vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator f_iter;

    for (f_iter = fields.begin(); f_iter != fields.end();) {
      t_field *tfield = (*f_iter);
      out << tfield->get_name() << ": " << tfield->get_name();
      if (++f_iter != fields.end()) {
        out << ", ";
      }
    }
    out << ")" << endl;
    indent(out) << "try " << argsname << ".writeValue(__args, toProtocol: __outProtocol)" << endl << endl;
    indent(out) << "try __outProtocol.writeMessageEnd()" << endl;
  }

  block_close(out);
  out << endl;
}